

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

void __thiscall PruneReplayer::access_graphics_pipelines(PruneReplayer *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->graphics_pipelines)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    access_graphics_pipeline
              (this,(Hash)p_Var1[1]._M_nxt,(VkGraphicsPipelineCreateInfo *)p_Var1[2]._M_nxt);
  }
  return;
}

Assistant:

void access_graphics_pipelines()
	{
		for (auto &pipe : graphics_pipelines)
			access_graphics_pipeline(pipe.first, pipe.second);
	}